

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

reentrant_put_transaction<void> * __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::try_start_reentrant_dyn_push_move
          (reentrant_put_transaction<void> *__return_storage_ptr__,
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,void *i_source)

{
  void *pvVar1;
  Allocation push_data;
  Allocation local_60;
  reentrant_put_transaction<void> local_48;
  
  detail::
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  ::try_inplace_allocate
            (&local_60,
             (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
              *)this,i_progress_guarantee,1,true,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size,
             (i_type->m_feature_table->
             super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             ).
             super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
             .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment);
  pvVar1 = local_60.m_user_storage;
  if (local_60.m_user_storage == (void *)0x0) {
    local_48.m_queue =
         (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *)0x0;
    local_48.m_put.m_control_block = (LfQueueControl *)0x0;
    local_48.m_put.m_next_ptr = 0;
    (__return_storage_ptr__->m_put).m_user_storage = (void *)0x0;
    (__return_storage_ptr__->m_put).m_control_block = (LfQueueControl *)0x0;
    (__return_storage_ptr__->m_put).m_next_ptr = 0;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
  }
  else {
    local_60.m_control_block[1].m_next = (uintptr_t)i_type->m_feature_table;
    if (i_type->m_feature_table == (tuple_type *)0x0) {
      density_tests::detail::assert_failed<>
                ("!empty()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/runtime_type.h"
                 ,0x394);
    }
    (*(i_type->m_feature_table->
      super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      ).
      super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      .
      super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>
      .super__Tuple_impl<3UL,_density::f_move_construct,_density::f_rtti,_density::f_destroy>.
      super__Head_base<3UL,_density::f_move_construct,_false>._M_head_impl.m_function)
              (pvVar1,i_source);
    local_48.m_put.m_control_block = local_60.m_control_block;
    local_48.m_put.m_next_ptr = local_60.m_next_ptr;
    (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)this;
    local_48.m_queue = this;
  }
  local_48.m_put.m_user_storage = (void *)0x0;
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<> try_start_reentrant_dyn_push_move(
          progress_guarantee i_progress_guarantee, const runtime_type & i_type, void * i_source)
        {
            auto push_data = Base::try_inplace_allocate(
              i_progress_guarantee, detail::LfQueue_Busy, true, i_type.size(), i_type.alignment());
            if (push_data.m_user_storage == nullptr)
            {
                return reentrant_put_transaction<>();
            }

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(i_type);

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                i_type.move_construct(push_data.m_user_storage, i_source);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<void>(PrivateType(), this, push_data);
        }